

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Response.cpp
# Opt level: O0

Response * jaegertracing::net::http::Response::parse(Response *__return_storage_ptr__,istream *in)

{
  byte bVar1;
  bool bVar2;
  istream *piVar3;
  size_type sVar4;
  ParseError *__return_storage_ptr___00;
  const_reference pvVar5;
  istreambuf_iterator<char,_std::char_traits<char>_> __beg;
  istreambuf_iterator<char,_std::char_traits<char>_> __end;
  allocator<char> local_2d1;
  undefined1 local_2d0 [12];
  undefined1 local_2c0 [12];
  string local_2b0 [32];
  string_type local_290;
  string_type local_270;
  istringstream local_250 [8];
  istringstream iss;
  string_type local_d0;
  byte local_ab;
  undefined1 local_aa;
  allocator local_a9;
  string local_a8;
  undefined1 local_78 [8];
  smatch match;
  string line;
  regex statusLinePattern;
  istream *in_local;
  Response *response;
  
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)((long)&line.field_2 + 8),
             "HTTP/([0-9]\\.[0-9]) ([0-9]+) (.+)$",0x10);
  std::__cxx11::string::string((string *)&match._M_begin);
  std::__cxx11::
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   *)local_78);
  piVar3 = readLineCRLF(in,(string *)&match._M_begin);
  bVar1 = std::ios::operator!((ios *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18)));
  if ((((bVar1 & 1) == 0) &&
      (bVar2 = std::
               regex_match<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                         ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &match._M_begin,
                          (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                           *)local_78,
                          (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                          ((long)&line.field_2 + 8),0), bVar2)) &&
     (sVar4 = std::__cxx11::
              match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              ::size((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      *)local_78), 3 < sVar4)) {
    local_ab = 0;
    Response(__return_storage_ptr__);
    pvVar5 = std::__cxx11::
             match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                           *)local_78,1);
    std::__cxx11::sub_match::operator_cast_to_string(&local_d0,(sub_match *)pvVar5);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_d0);
    pvVar5 = std::__cxx11::
             match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                           *)local_78,2);
    std::__cxx11::sub_match::operator_cast_to_string(&local_270,(sub_match *)pvVar5);
    std::__cxx11::istringstream::istringstream(local_250,(string *)&local_270,_S_in);
    std::__cxx11::string::~string((string *)&local_270);
    std::istream::operator>>(local_250,&__return_storage_ptr__->_statusCode);
    pvVar5 = std::__cxx11::
             match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                           *)local_78,3);
    std::__cxx11::sub_match::operator_cast_to_string(&local_290,(sub_match *)pvVar5);
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->_reason,(string *)&local_290)
    ;
    std::__cxx11::string::~string((string *)&local_290);
    readHeaders(in,&__return_storage_ptr__->_headers);
    std::istreambuf_iterator<char,_std::char_traits<char>_>::istreambuf_iterator
              ((istreambuf_iterator<char,_std::char_traits<char>_> *)local_2c0,in);
    std::istreambuf_iterator<char,_std::char_traits<char>_>::istreambuf_iterator
              ((istreambuf_iterator<char,_std::char_traits<char>_> *)local_2d0);
    std::allocator<char>::allocator();
    __beg._12_4_ = 0;
    __beg._M_sbuf = (streambuf_type *)local_2c0._0_8_;
    __beg._M_c = local_2c0._8_4_;
    __end._12_4_ = 0;
    __end._M_sbuf = (streambuf_type *)local_2d0._0_8_;
    __end._M_c = local_2d0._8_4_;
    std::__cxx11::string::string<std::istreambuf_iterator<char,std::char_traits<char>>,void>
              (local_2b0,__beg,__end,&local_2d1);
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->_body,local_2b0);
    std::__cxx11::string::~string(local_2b0);
    std::allocator<char>::~allocator(&local_2d1);
    local_ab = 1;
    std::__cxx11::istringstream::~istringstream(local_250);
    if ((local_ab & 1) == 0) {
      ~Response(__return_storage_ptr__);
    }
    std::__cxx11::
    match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::~match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      *)local_78);
    std::__cxx11::string::~string((string *)&match._M_begin);
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
              ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)((long)&line.field_2 + 8));
    return __return_storage_ptr__;
  }
  local_aa = 1;
  __return_storage_ptr___00 = (ParseError *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_a8,"status line",&local_a9);
  ParseError::make(__return_storage_ptr___00,&local_a8,(string *)&match._M_begin);
  local_aa = 0;
  __cxa_throw(__return_storage_ptr___00,&ParseError::typeinfo,ParseError::~ParseError);
}

Assistant:

Response Response::parse(std::istream& in)
{
    const std::regex statusLinePattern("HTTP/([0-9]\\.[0-9]) ([0-9]+) (.+)$");
    std::string line;
    std::smatch match;
    if (!readLineCRLF(in, line) ||
        !std::regex_match(line, match, statusLinePattern) || match.size() < 4) {
        throw ParseError::make("status line", line);
    }
    Response response;
    response._version = match[1];
    std::istringstream iss(match[2]);
    iss >> response._statusCode;
    response._reason = match[3];

    readHeaders(in, response._headers);

    response._body = std::string(std::istreambuf_iterator<char>(in),
                                 std::istreambuf_iterator<char>{});

    return response;
}